

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::torrent::status(torrent *this,torrent_status *st,status_flags_t flags)

{
  info_hash_t *piVar1;
  sha256_hash *this_00;
  header_holder_type *phVar2;
  uint *puVar3;
  int iVar4;
  pointer pcVar5;
  peer_list *ppVar6;
  _Map_pointer ppptVar7;
  _Head_base<0UL,_unsigned_int_*,_false> _Var8;
  node_ptr plVar9;
  element_type *peVar10;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> this_01;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  error_category *peVar18;
  int64_t iVar19;
  undefined3 uVar20;
  time_t tVar21;
  undefined2 uVar22;
  bool bVar23;
  bool bVar24;
  int iVar25;
  seconds32 sVar26;
  uint uVar27;
  info_hash_t *piVar28;
  undefined4 extraout_var;
  long lVar29;
  torrent_flags_t tVar30;
  int *piVar31;
  pair<int,_int> pVar32;
  uint uVar33;
  long lVar34;
  node_ptr plVar35;
  node_ptr plVar36;
  node_ptr plVar37;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> i;
  piece_index_t index;
  float fVar38;
  undefined1 local_60 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  info_hash_t *local_38;
  
  local_40._M_pi._0_4_ = time_now32();
  get_handle((torrent *)local_60);
  ::std::__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)st,
             (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)local_60);
  if ((_Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>)local_60._8_8_ !=
      (_Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      piVar31 = (int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_60._8_8_)->
                               super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                               ).
                               super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 4);
      iVar25 = *piVar31;
      *piVar31 = *piVar31 + -1;
      UNLOCK();
    }
    else {
      iVar25 = *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_60._8_8_)->
                               super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                               ).
                               super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 4);
      *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_60._8_8_)->
                      super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                      ).
                      super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar25 + -1;
    }
    if (iVar25 == 1) {
      (*(code *)(((vector<piece_pos,_piece_index_t> *)local_60._8_8_)->
                super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                ).
                super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                ._M_impl.super__Vector_impl_data._M_start[3])();
    }
  }
  piVar1 = &this->m_info_hash;
  (st->info_hashes).v2.m_number._M_elems[7] = (this->m_info_hash).v2.m_number._M_elems[7];
  uVar13 = *(undefined8 *)(this->m_info_hash).v1.m_number._M_elems;
  uVar14 = *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 2);
  uVar15 = *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 4);
  uVar16 = *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 1);
  uVar17 = *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 5);
  *(undefined8 *)((st->info_hashes).v2.m_number._M_elems + 3) =
       *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 3);
  *(undefined8 *)((st->info_hashes).v2.m_number._M_elems + 5) = uVar17;
  *(undefined8 *)((st->info_hashes).v1.m_number._M_elems + 4) = uVar15;
  *(undefined8 *)((st->info_hashes).v2.m_number._M_elems + 1) = uVar16;
  *(undefined8 *)(st->info_hashes).v1.m_number._M_elems = uVar13;
  *(undefined8 *)((st->info_hashes).v1.m_number._M_elems + 2) = uVar14;
  this_00 = &(this->m_info_hash).v2;
  bVar23 = digest32<256L>::is_all_zeros(this_00);
  piVar28 = (info_hash_t *)this_00;
  if (bVar23) {
    piVar28 = piVar1;
  }
  uVar33 = (piVar28->v1).m_number._M_elems[4];
  uVar13 = *(undefined8 *)((piVar28->v1).m_number._M_elems + 2);
  *(undefined8 *)(st->info_hash).m_number._M_elems = *(undefined8 *)(piVar28->v1).m_number._M_elems;
  *(undefined8 *)((st->info_hash).m_number._M_elems + 2) = uVar13;
  (st->info_hash).m_number._M_elems[4] = uVar33;
  local_38 = piVar1;
  if ((flags.m_val & 0x40) != 0) {
    name_abi_cxx11_((string *)local_60,this);
    ::std::__cxx11::string::operator=((string *)&st->name,(string *)local_60);
    if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
      operator_delete((void *)local_60._0_8_,(ulong)(local_60._16_8_ + 1));
    }
  }
  if ((char)flags.m_val < '\0') {
    pcVar5 = (this->m_save_path)._M_dataplus._M_p;
    local_60._0_8_ = local_60 + 0x10;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_60,pcVar5,pcVar5 + (this->m_save_path)._M_string_length);
    ::std::__cxx11::string::operator=((string *)&st->save_path,(string *)local_60);
    if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
      operator_delete((void *)local_60._0_8_,(ulong)(local_60._16_8_ + 1));
    }
  }
  if ((flags.m_val & 0x20) != 0) {
    (st->torrent_file).super___weak_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (this->super_torrent_hot_members).m_torrent_file.
             super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(st->torrent_file).
                super___weak_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               &(this->super_torrent_hot_members).m_torrent_file.
                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
  }
  st->has_incoming = (bool)((byte)this->field_0x5c0 >> 2 & 1);
  bVar23 = (this->m_error).failed_;
  uVar20 = *(undefined3 *)&(this->m_error).field_0x5;
  peVar18 = (this->m_error).cat_;
  (st->errc).val_ = (this->m_error).val_;
  (st->errc).failed_ = bVar23;
  *(undefined3 *)&(st->errc).field_0x5 = uVar20;
  (st->errc).cat_ = peVar18;
  (st->error_file).m_val = (this->m_error_file).m_val;
  st->moving_storage = (bool)((byte)this->field_0x600 >> 5 & 1);
  st->announcing_to_trackers = (bool)(this->field_0x5c0 & 1);
  st->announcing_to_lsd = (bool)((byte)this->field_0x5c0 >> 1 & 1);
  st->announcing_to_dht = (bool)(this->field_0x5e0 & 1);
  uVar11 = *(undefined4 *)((long)&this->m_added_time + 4);
  tVar21 = this->m_completed_time;
  uVar12 = *(undefined4 *)((long)&this->m_completed_time + 4);
  *(int *)&st->added_time = (int)this->m_added_time;
  *(undefined4 *)((long)&st->added_time + 4) = uVar11;
  *(int *)&st->completed_time = (int)tVar21;
  *(undefined4 *)((long)&st->completed_time + 4) = uVar12;
  st->up_bandwidth_queue = 0;
  st->down_bandwidth_queue = 0;
  st->num_peers =
       ((int)((ulong)((long)(this->super_torrent_hot_members).m_connections.
                            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                            .
                            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->super_torrent_hot_members).m_connections.
                           super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                           .
                           super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3) -
       (int)((ulong)((long)(this->m_peers_to_disconnect).
                           super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_peers_to_disconnect).
                          super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4)) -
       (uint)this->m_num_connecting;
  ppVar6 = (this->super_torrent_hot_members).m_peer_list._M_t.
           super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
           ._M_t.
           super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
           .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl;
  if (ppVar6 == (peer_list *)0x0) {
    st->list_peers = 0;
    uVar33 = 0;
    iVar25 = 0;
  }
  else {
    ppptVar7 = (ppVar6->m_peers).
               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               .
               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node;
    st->list_peers =
         (int)((ulong)((long)(ppVar6->m_peers).
                             super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                             .
                             super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_last -
                      (long)(ppVar6->m_peers).
                            super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                            .
                            super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) +
         (int)((ulong)((long)(ppVar6->m_peers).
                             super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                             .
                             super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)(ppVar6->m_peers).
                            super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                            .
                            super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) +
         ((((uint)((int)ppptVar7 -
                  *(int *)&(ppVar6->m_peers).
                           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                           .
                           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
         (uint)(ppptVar7 == (_Map_pointer)0x0)) * 0x40;
    uVar33 = *(uint *)&ppVar6->field_0x60 & 0x7fffffff;
    iVar25 = ppVar6->m_num_connect_candidates;
  }
  st->list_seeds = uVar33;
  st->connect_candidates = iVar25;
  iVar25 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
             [0x2e])();
  iVar25 = seed_rank(this,(session_settings *)CONCAT44(extraout_var,iVar25));
  st->seed_rank = iVar25;
  iVar19 = this->m_total_downloaded;
  st->all_time_upload = this->m_total_uploaded;
  st->all_time_download = iVar19;
  sVar26 = finished_time(this);
  (st->finished_duration).__r = (long)sVar26.__r;
  sVar26 = active_time(this);
  (st->active_duration).__r = (long)sVar26.__r;
  sVar26 = seeding_time(this);
  (st->seeding_duration).__r = (long)sVar26.__r;
  (st->last_upload).__d.__r = (long)(this->m_last_upload).__d.__r * 1000000000;
  (st->last_download).__d.__r = (long)(this->m_last_download).__d.__r * 1000000000;
  st->storage_mode = *(uint *)&this->field_0x5c0 >> 4 & 3;
  uVar33 = *(uint *)&(this->super_torrent_hot_members).field_0x48 & 0xffffff;
  if (uVar33 == 0xffffff) {
    uVar33 = 0xffffffff;
  }
  st->num_complete = uVar33;
  uVar33 = *(uint *)&this->field_0x5dd & 0xffffff;
  if (uVar33 == 0xffffff) {
    uVar33 = 0xffffffff;
  }
  st->num_incomplete = uVar33;
  bVar23 = is_seed(this);
  st->is_seeding = bVar23;
  bVar23 = is_finished(this);
  st->is_finished = bVar23;
  st->has_metadata =
       0 < (((this->super_torrent_hot_members).m_torrent_file.
             super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           m_files).m_piece_length;
  bytes_done(this,st,flags);
  lVar29 = *(long *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                     field_0x20;
  st->total_payload_download = lVar29;
  lVar34 = *(long *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>;
  st->total_payload_upload = lVar34;
  st->total_download =
       lVar29 + *(long *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                          field_0x30;
  st->total_upload =
       lVar34 + *(long *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                          field_0x10;
  iVar19 = this->m_total_redundant_bytes;
  st->total_failed_bytes = this->m_total_failed_bytes;
  st->total_redundant_bytes = iVar19;
  iVar25 = *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x2c
  ;
  st->download_rate =
       *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x3c +
       iVar25 + *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                         field_0x5c;
  iVar4 = *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0xc;
  st->upload_rate =
       *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x1c +
       iVar4 + *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                        field_0x4c;
  st->download_payload_rate = iVar25;
  st->upload_payload_rate = iVar4;
  if (((this->super_torrent_hot_members).field_0x4b & 0x18) == 0) {
    lVar29 = (this->m_tracker_timer).impl_.implementation_.expiry.__d.__r;
    lVar34 = (long)(int)local_40._M_pi._0_4_;
    if ((SBORROW8(lVar29,lVar34 * 1000000000) != lVar29 + lVar34 * -1000000000 < 0) ||
       (lVar29 = lVar29 + lVar34 * -1000000000, (st->next_announce).__r = lVar29, lVar29 < 0))
    goto LAB_0032a91b;
  }
  else {
LAB_0032a91b:
    (st->next_announce).__r = 0;
  }
  tracker_list::last_working_url_abi_cxx11_((string *)local_60,&this->m_trackers);
  local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&st->current_tracker;
  ::std::__cxx11::string::operator=((string *)local_40._M_pi,(string *)local_60);
  if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
    operator_delete((void *)local_60._0_8_,(ulong)(local_60._16_8_ + 1));
  }
  if ((st->current_tracker)._M_string_length == 0) {
    bVar23 = digest32<160L>::is_all_zeros(&local_38->v1);
    bVar24 = digest32<256L>::is_all_zeros(this_00);
    uVar13 = local_60._0_8_;
    phVar2 = &(this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header;
    plVar35 = (this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header.super_node.
              next_;
    if (plVar35 != &phVar2->super_node) {
      local_60[1] = !bVar24;
      local_60[0] = !bVar23;
      uVar22 = local_60._0_2_;
      local_60._0_8_ = uVar13;
      do {
        if (((ulong)plVar35[6].prev_ & 0x10000000000000) != 0) {
          plVar37 = plVar35[5].next_;
          plVar9 = plVar35[5].prev_;
          local_60._0_8_ = CONCAT62(local_60._2_6_,uVar22);
          lVar34 = (long)plVar9 - (long)plVar37;
          lVar29 = (lVar34 >> 3) * -0x70a3d70a3d70a3d7 >> 2;
          if (0 < lVar29) {
            plVar36 = plVar37 + lVar29 * 0x32;
            do {
              lVar34 = 0;
              while ((local_60[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar34]] !=
                      '\x01' ||
                     ((*(byte *)((long)plVar37 +
                                (ulong)(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)
                                             [lVar34] * 0x48 + 100) & 0x80) == 0))) {
                lVar34 = lVar34 + 1;
                if (lVar34 == 2) goto LAB_0032abe3;
              }
              lVar34 = 0;
              while ((local_60[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar34]] !=
                      '\x01' ||
                     ((*(byte *)((long)plVar37 +
                                (ulong)(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)
                                             [lVar34] * 0x48 + 300) & 0x80) == 0))) {
                lVar34 = lVar34 + 1;
                if (lVar34 == 2) {
                  plVar37 = (node_ptr)&plVar37[0xc].prev_;
                  goto LAB_0032abe3;
                }
              }
              lVar34 = 0;
              while ((local_60[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar34]] !=
                      '\x01' ||
                     ((*(byte *)((long)plVar37 +
                                (ulong)(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)
                                             [lVar34] * 0x48 + 500) & 0x80) == 0))) {
                lVar34 = lVar34 + 1;
                if (lVar34 == 2) {
                  plVar37 = plVar37 + 0x19;
                  goto LAB_0032abe3;
                }
              }
              lVar34 = 0;
              while ((local_60[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar34]] !=
                      '\x01' ||
                     ((*(byte *)((long)plVar37 +
                                (ulong)(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)
                                             [lVar34] * 0x48 + 700) & 0x80) == 0))) {
                lVar34 = lVar34 + 1;
                if (lVar34 == 2) {
                  plVar37 = (node_ptr)&plVar37[0x25].prev_;
                  goto LAB_0032abe3;
                }
              }
              plVar37 = plVar37 + 0x32;
              bVar23 = 1 < lVar29;
              lVar29 = lVar29 + -1;
            } while (bVar23);
            lVar34 = (long)plVar9 - (long)plVar36;
            plVar37 = plVar36;
          }
          lVar29 = (lVar34 >> 3) * -0x70a3d70a3d70a3d7;
          if (lVar29 == 1) {
LAB_0032abaf:
            lVar29 = 0;
            do {
              if ((local_60[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar29]] ==
                   '\x01') &&
                 ((*(byte *)((long)plVar37 +
                            (ulong)(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar29]
                            * 0x48 + 100) & 0x80) != 0)) goto LAB_0032abf9;
              lVar29 = lVar29 + 1;
            } while (lVar29 != 2);
LAB_0032abe3:
            if (plVar37 != plVar9) goto LAB_0032abe8;
          }
          else {
            if (lVar29 == 2) {
LAB_0032ab7e:
              lVar29 = 0;
              do {
                if ((local_60[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar29]] ==
                     '\x01') &&
                   ((*(byte *)((long)plVar37 +
                              (ulong)(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)
                                           [lVar29] * 0x48 + 100) & 0x80) != 0)) {
                  plVar37 = (node_ptr)&plVar37[0xc].prev_;
                  goto LAB_0032abaf;
                }
                lVar29 = lVar29 + 1;
              } while (lVar29 != 2);
              goto LAB_0032abe3;
            }
            if (lVar29 == 3) {
              lVar29 = 0;
              do {
                if ((local_60[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar29]] ==
                     '\x01') &&
                   ((*(byte *)((long)plVar37 +
                              (ulong)(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)
                                           [lVar29] * 0x48 + 100) & 0x80) != 0)) {
                  plVar37 = (node_ptr)&plVar37[0xc].prev_;
                  goto LAB_0032ab7e;
                }
                lVar29 = lVar29 + 1;
              } while (lVar29 != 2);
              goto LAB_0032abe3;
            }
          }
LAB_0032abf9:
          ::std::__cxx11::string::_M_assign((string *)local_40._M_pi);
          break;
        }
LAB_0032abe8:
        plVar35 = plVar35->next_;
      } while (plVar35 != &phVar2->super_node);
    }
  }
  if ((flags.m_val & 0x10) != 0) {
    if (&this->m_verified != &st->verified_pieces) {
      _Var8._M_head_impl =
           *(uint **)&(this->m_verified).super_bitfield.m_buf.
                      super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                      super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t
                      .super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
      piVar31 = (int *)(_Var8._M_head_impl + 1);
      if ((_Head_base<0UL,_unsigned_int_*,_false>)_Var8._M_head_impl ==
          (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
        uVar33 = 0;
        piVar31 = (int *)0x0;
      }
      else {
        uVar33 = *_Var8._M_head_impl;
      }
      bitfield::assign(&(st->verified_pieces).super_bitfield,(char *)piVar31,uVar33);
    }
  }
  st->num_uploads = *(uint *)&this->field_0x5d8 & 0xffffff;
  uVar33 = (uint)*(uint3 *)&this->field_0x5d4;
  if (uVar33 == 0xffffff) {
    uVar33 = 0xffffffff;
  }
  st->uploads_limit = uVar33;
  st->num_connections =
       (int)((ulong)((long)(this->super_torrent_hot_members).m_connections.
                           super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                           .
                           super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->super_torrent_hot_members).m_connections.
                          super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          .
                          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) -
       (int)((ulong)((long)(this->m_peers_to_disconnect).
                           super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_peers_to_disconnect).
                          super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4);
  uVar33 = (uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x21) &
           0xffffff;
  if (uVar33 == 0xffffff) {
    uVar33 = 0xffffffff;
  }
  st->connections_limit = uVar33;
  (st->queue_position).m_val = (this->m_sequence_number).m_val;
  st->need_save_resume = (this->m_need_save_resume_data).m_val != '\0';
  (st->need_save_resume_data).m_val = (this->m_need_save_resume_data).m_val;
  st->state = (state_t)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39)
              & checking_resume_data;
  tVar30 = torrent::flags(this);
  (st->flags).m_val = tVar30.m_val;
  peVar10 = (this->super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar33 = (peVar10->m_files).m_piece_length;
  if ((int)uVar33 < 1) {
    st->state = downloading_metadata;
    st->progress_ppm = *(uint3 *)&this->field_0x604 & 0xfffff;
    st->progress = (float)(*(uint3 *)&this->field_0x604 & 0xfffff) / 1e+06;
    st->block_size = 0;
    return;
  }
  uVar27 = 0x4000;
  if (uVar33 < 0x4000) {
    uVar27 = uVar33;
  }
  st->block_size = uVar27;
  if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 & 0xe00000000000000) ==
      0x200000000000000) {
    st->progress_ppm = *(uint3 *)&this->field_0x604 & 0xfffff;
    uVar33 = *(uint3 *)&this->field_0x604 & 0xfffff;
LAB_0032addd:
    fVar38 = (float)(int)uVar33 / 1e+06;
  }
  else {
    if (st->total_wanted != 0) {
      uVar33 = (uint)((st->total_wanted_done * 1000000) / st->total_wanted);
      st->progress_ppm = uVar33;
      goto LAB_0032addd;
    }
    st->progress_ppm = 1000000;
    fVar38 = 1.0;
  }
  st->progress = fVar38;
  if ((flags.m_val & 8) != 0) {
    iVar25 = (peVar10->m_files).m_num_pieces;
    if ((this->super_torrent_hot_members).m_picker._M_t.
        super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
        ._M_t.
        super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
        .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl ==
        (piece_picker *)0x0) {
      bitfield::resize(&(st->pieces).super_bitfield,iVar25,
                       (bool)((byte)((uint)*(undefined4 *)
                                            &(this->super_torrent_hot_members).field_0x48 >> 0x1e) &
                             1));
    }
    else {
      bitfield::resize(&(st->pieces).super_bitfield,iVar25,false);
      _Var8._M_head_impl =
           *(uint **)&(st->pieces).super_bitfield.m_buf.
                      super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                      super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t
                      .super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
      if (((_Head_base<0UL,_unsigned_int_*,_false>)_Var8._M_head_impl !=
           (_Head_base<0UL,_unsigned_int_*,_false>)0x0) &&
         (uVar33 = *_Var8._M_head_impl, uVar33 != 0)) {
        index.m_val = 0;
        do {
          bVar23 = piece_picker::has_piece_passed
                             ((this->super_torrent_hot_members).m_picker._M_t.
                              super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                              .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                              _M_head_impl,index);
          if (bVar23) {
            uVar27 = 0x80000000 >> ((byte)index.m_val & 0x1f);
            puVar3 = (uint *)((long)(st->pieces).super_bitfield.m_buf.
                                    super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>
                                    ._M_t.
                                    super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                              + 4 + (ulong)((uint)index.m_val >> 5) * 4);
            *puVar3 = *puVar3 | uVar27 >> 0x18 | (uVar27 & 0xff0000) >> 8 | (uVar27 & 0xff00) << 8 |
                                uVar27 << 0x18;
          }
          index.m_val = index.m_val + 1;
        } while (uVar33 != index.m_val);
      }
    }
  }
  this_01._M_head_impl =
       (this->super_torrent_hot_members).m_picker._M_t.
       super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
       ._M_t.
       super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
       .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
  if (this_01._M_head_impl == (piece_picker *)0x0) {
    iVar25 = 0;
    if (((this->super_torrent_hot_members).field_0x4b & 0x40) == 0) goto LAB_0032aeae;
    piVar31 = &(((this->super_torrent_hot_members).m_torrent_file.
                 super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               m_files).m_num_pieces;
  }
  else {
    piVar31 = &(this_01._M_head_impl)->m_num_passed;
  }
  iVar25 = *piVar31;
LAB_0032aeae:
  st->num_pieces = iVar25;
  st->num_seeds = (uint)this->m_num_seeds - (uint)this->m_num_connecting_seeds;
  if ((flags.m_val & 1) == 0 || this_01._M_head_impl == (piece_picker *)0x0) {
    st->distributed_full_copies = -1;
    fVar38 = -1.0;
    iVar25 = -1;
  }
  else {
    pVar32 = piece_picker::distributed_copies(this_01._M_head_impl);
    iVar25 = pVar32.second;
    st->distributed_full_copies = pVar32.first;
    fVar38 = (float)iVar25 / 1000.0 + (float)pVar32.first;
  }
  st->distributed_fraction = iVar25;
  st->distributed_copies = fVar38;
  st->last_seen_complete = this->m_swarm_last_seen_complete;
  return;
}

Assistant:

void torrent::status(torrent_status* st, status_flags_t const flags)
	{
		INVARIANT_CHECK;

		time_point32 const now = aux::time_now32();

		st->handle = get_handle();
		st->info_hashes = info_hash();
#if TORRENT_ABI_VERSION < 3
		st->info_hash = info_hash().get_best();
#endif
#if TORRENT_ABI_VERSION == 1
		st->is_loaded = true;
#endif

		if (flags & torrent_handle::query_name)
			st->name = name();

		if (flags & torrent_handle::query_save_path)
			st->save_path = save_path();

		if (flags & torrent_handle::query_torrent_file)
			st->torrent_file = m_torrent_file;

		st->has_incoming = m_has_incoming;
		st->errc = m_error;
		st->error_file = m_error_file;

#if TORRENT_ABI_VERSION == 1
		if (m_error) st->error = m_error.message()
			+ ": " + resolve_filename(m_error_file);
		st->seed_mode = m_seed_mode;
#endif
		st->moving_storage = m_moving_storage;

		st->announcing_to_trackers = m_announce_to_trackers;
		st->announcing_to_lsd = m_announce_to_lsd;
		st->announcing_to_dht = m_announce_to_dht;
#if TORRENT_ABI_VERSION == 1
		st->stop_when_ready = m_stop_when_ready;
#endif

		st->added_time = m_added_time;
		st->completed_time = m_completed_time;

#if TORRENT_ABI_VERSION == 1
		st->last_scrape = static_cast<int>(total_seconds(now - m_last_scrape));
#endif

#if TORRENT_ABI_VERSION == 1
#ifndef TORRENT_DISABLE_SHARE_MODE
		st->share_mode = m_share_mode;
#else
		st->share_mode = false;
#endif
		st->upload_mode = m_upload_mode;
#endif
		st->up_bandwidth_queue = 0;
		st->down_bandwidth_queue = 0;
#if TORRENT_ABI_VERSION == 1
		st->priority = priority();
#endif

		st->num_peers = num_peers() - m_num_connecting;

		st->list_peers = m_peer_list ? m_peer_list->num_peers() : 0;
		st->list_seeds = m_peer_list ? m_peer_list->num_seeds() : 0;
		st->connect_candidates = m_peer_list ? m_peer_list->num_connect_candidates() : 0;
		TORRENT_ASSERT(st->connect_candidates >= 0);
		st->seed_rank = seed_rank(settings());

		st->all_time_upload = m_total_uploaded;
		st->all_time_download = m_total_downloaded;

		// activity time
#if TORRENT_ABI_VERSION == 1
		st->finished_time = int(total_seconds(finished_time()));
		st->active_time = int(total_seconds(active_time()));
		st->seeding_time = int(total_seconds(seeding_time()));

		time_point32 const unset{seconds32(0)};

		st->time_since_upload = m_last_upload == unset ? -1
			: static_cast<int>(total_seconds(now - m_last_upload));
		st->time_since_download = m_last_download == unset ? -1
			: static_cast<int>(total_seconds(now - m_last_download));
#endif

		st->finished_duration = finished_time();
		st->active_duration = active_time();
		st->seeding_duration = seeding_time();

		st->last_upload = m_last_upload;
		st->last_download = m_last_download;

		st->storage_mode = static_cast<storage_mode_t>(m_storage_mode);

		st->num_complete = (m_complete == 0xffffff) ? -1 : m_complete;
		st->num_incomplete = (m_incomplete == 0xffffff) ? -1 : m_incomplete;
#if TORRENT_ABI_VERSION == 1
		st->paused = is_torrent_paused();
		st->auto_managed = m_auto_managed;
		st->sequential_download = m_sequential_download;
#endif
		st->is_seeding = is_seed();
		st->is_finished = is_finished();
#if TORRENT_ABI_VERSION == 1
#ifndef TORRENT_DISABLE_SUPERSEEDING
		st->super_seeding = m_super_seeding;
#endif
#endif
		st->has_metadata = valid_metadata();
		bytes_done(*st, flags);
		TORRENT_ASSERT(st->total_wanted_done >= 0);
		TORRENT_ASSERT(st->total_done >= st->total_wanted_done);

		// payload transfer
		st->total_payload_download = m_stat.total_payload_download();
		st->total_payload_upload = m_stat.total_payload_upload();

		// total transfer
		st->total_download = m_stat.total_payload_download()
			+ m_stat.total_protocol_download();
		st->total_upload = m_stat.total_payload_upload()
			+ m_stat.total_protocol_upload();

		// failed bytes
		st->total_failed_bytes = m_total_failed_bytes;
		st->total_redundant_bytes = m_total_redundant_bytes;

		// transfer rate
		st->download_rate = m_stat.download_rate();
		st->upload_rate = m_stat.upload_rate();
		st->download_payload_rate = m_stat.download_payload_rate();
		st->upload_payload_rate = m_stat.upload_payload_rate();

		if (is_paused() || m_tracker_timer.expiry() < now)
			st->next_announce = seconds(0);
		else
			st->next_announce = m_tracker_timer.expiry() - now;

		if (st->next_announce.count() < 0)
			st->next_announce = seconds(0);

#if TORRENT_ABI_VERSION == 1
		st->announce_interval = seconds(0);
#endif

		st->current_tracker = m_trackers.last_working_url();
		if (st->current_tracker.empty())
		{
#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wmissing-braces"
#endif
			aux::array<bool const, num_protocols, protocol_version> const supports_protocol{
			{
				m_info_hash.has_v1(),
				m_info_hash.has_v2()
			}};
#ifdef __clang__
#pragma clang diagnostic pop
#endif

			for (auto const& t : m_trackers)
			{
				if (!t.verified) continue;
				if (std::any_of(t.endpoints.begin(), t.endpoints.end()
					, [supports_protocol](aux::announce_endpoint const& aep) {
						for (protocol_version const ih : all_versions)
						{
							if (supports_protocol[ih] && aep.info_hashes[ih].updating)
								return false;
						}
						return true;
					})) continue;
				st->current_tracker = t.url;
				break;
			}
		}

		if ((flags & torrent_handle::query_verified_pieces))
		{
			st->verified_pieces = m_verified;
		}

		st->num_uploads = m_num_uploads;
		st->uploads_limit = m_max_uploads == (1 << 24) - 1 ? -1 : m_max_uploads;
		st->num_connections = num_peers();
		st->connections_limit = m_max_connections == (1 << 24) - 1 ? -1 : m_max_connections;
		// if we don't have any metadata, stop here

		st->queue_position = queue_position();
#if TORRENT_ABI_VERSION < 4
		st->need_save_resume = bool(m_need_save_resume_data);
#endif
		st->need_save_resume_data = m_need_save_resume_data;
#if TORRENT_ABI_VERSION == 1
		st->ip_filter_applies = m_apply_ip_filter;
#endif

		st->state = static_cast<torrent_status::state_t>(m_state);
		st->flags = this->flags();

#if TORRENT_USE_ASSERTS
		if (st->state == torrent_status::finished
			|| st->state == torrent_status::seeding)
		{
			// it may be tempting to assume that st->is_finished == true here, but
			// this assumption does not always hold. We transition to "finished"
			// when we receive the last block of the last piece, which is before
			// the hash check comes back. "is_finished" is set to true once all the
			// pieces have been hash checked. So, there's a short window where it
			// doesn't hold.
		}
#endif

		if (!valid_metadata())
		{
			st->state = torrent_status::downloading_metadata;
			st->progress_ppm = m_progress_ppm;
#if !TORRENT_NO_FPU
			st->progress = m_progress_ppm / 1000000.f;
#endif
			st->block_size = 0;
			return;
		}

		st->block_size = block_size();

		if (m_state == torrent_status::checking_files)
		{
			st->progress_ppm = m_progress_ppm;
#if !TORRENT_NO_FPU
			st->progress = m_progress_ppm / 1000000.f;
#endif
		}
		else if (st->total_wanted == 0)
		{
			st->progress_ppm = 1000000;
			st->progress = 1.f;
		}
		else
		{
			st->progress_ppm = int(st->total_wanted_done * 1000000
				/ st->total_wanted);
#if !TORRENT_NO_FPU
			st->progress = float(st->progress_ppm) / 1000000.f;
#endif
		}

		if (flags & torrent_handle::query_pieces)
		{
			int const num_pieces = m_torrent_file->num_pieces();
			if (has_picker())
			{
				st->pieces.resize(num_pieces, false);
				for (auto const i : st->pieces.range())
					if (m_picker->has_piece_passed(i)) st->pieces.set_bit(i);
			}
			else if (m_have_all)
			{
				st->pieces.resize(num_pieces, true);
			}
			else
			{
				st->pieces.resize(num_pieces, false);
			}
		}
		st->num_pieces = num_passed();
#if TORRENT_USE_INVARIANT_CHECKS
		{
			// The documentation states that `num_pieces` is the count of number
			// of bits set in `pieces`. Ensure that invariant holds.
			int num_have_pieces = 0;
			if (has_picker())
			{
				for (auto const i : m_torrent_file->piece_range())
					if (m_picker->has_piece_passed(i)) ++num_have_pieces;
			}
			else if (m_have_all)
			{
				num_have_pieces = m_torrent_file->num_pieces();
			}
			TORRENT_ASSERT(num_have_pieces == st->num_pieces);
		}
#endif
		st->num_seeds = num_seeds();
		if ((flags & torrent_handle::query_distributed_copies) && m_picker.get())
		{
			std::tie(st->distributed_full_copies, st->distributed_fraction) =
				m_picker->distributed_copies();
#if TORRENT_NO_FPU
			st->distributed_copies = -1.f;
#else
			st->distributed_copies = float(st->distributed_full_copies)
				+ float(st->distributed_fraction) / 1000;
#endif
		}
		else
		{
			st->distributed_full_copies = -1;
			st->distributed_fraction = -1;
			st->distributed_copies = -1.f;
		}

		st->last_seen_complete = m_swarm_last_seen_complete;
	}